

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txrequest_tests.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_d715c4::Scenario::ReceivedResponse(Scenario *this,NodeId peer,uint256 *txhash)

{
  long lVar1;
  anon_class_48_3_6b2a3e87 *in_RSI;
  duration<long,_std::ratio<1L,_1000000L>_> *in_RDI;
  long in_FS_OFFSET;
  Runner *runner;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  vector<std::pair<std::chrono::duration<long,std::ratio<1l,1000000l>>,std::function<void()>>,std::allocator<std::pair<std::chrono::duration<long,std::ratio<1l,1000000l>>,std::function<void()>>>>
  ::
  emplace_back<std::chrono::duration<long,std::ratio<1l,1000000l>>&,(anonymous_namespace)::Scenario::ReceivedResponse(long,uint256_const&)::_lambda()_1_>
            ((vector<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
              *)in_RDI[1].__r,in_RDI,in_RSI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ReceivedResponse(NodeId peer, const uint256& txhash)
    {
        auto& runner = m_runner;
        runner.actions.emplace_back(m_now, [=,&runner]() {
            runner.txrequest.ReceivedResponse(peer, txhash);
            runner.txrequest.SanityCheck();
        });
    }